

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void wiz_dark(chunk *c,player *p,_Bool full)

{
  _Bool _Var1;
  loc_conflict lVar2;
  loc_conflict grid_00;
  square_conflict *psVar3;
  loc grid_1;
  loc a_grid;
  loc grid;
  wchar_t x;
  wchar_t y;
  wchar_t i;
  _Bool full_local;
  player *p_local;
  chunk *c_local;
  
  grid.y = 1;
  do {
    if (c->height + L'\xffffffff' <= grid.y) {
      for (grid.y = 1; grid.y < c->height + L'\xffffffff'; grid.y = grid.y + 1) {
        for (grid.x = 1; grid.x < c->width + L'\xffffffff'; grid.x = grid.x + 1) {
          lVar2 = (loc_conflict)loc(grid.x,grid.y);
          _Var1 = square_in_bounds(c,lVar2);
          if (_Var1) {
            square_unmark(c,lVar2);
          }
        }
      }
      p->upkeep->update = p->upkeep->update | 0x60;
      p->upkeep->redraw = p->upkeep->redraw | 0xc10000;
      return;
    }
    for (grid.x = 1; grid.x < c->width + L'\xffffffff'; grid.x = grid.x + 1) {
      lVar2 = (loc_conflict)loc(grid.x,grid.y);
      _Var1 = square_seemslikewall(c,lVar2);
      if (_Var1) {
LAB_0012fb88:
        if (full) {
          square_know_pile(c,lVar2,(_func__Bool_object_ptr *)0x0);
        }
        else {
          square_sense_pile(c,lVar2,(_func__Bool_object_ptr *)0x0);
        }
        _Var1 = square_ismark(c,lVar2);
        if ((!_Var1) && (_Var1 = square_ismemorybad(c,lVar2), _Var1)) {
          square_forget(c,lVar2);
        }
      }
      else {
        _Var1 = square_in_bounds_fully(c,lVar2);
        if (_Var1) {
          for (x = L'\0'; x < L'\t'; x = x + L'\x01') {
            grid_00 = (loc_conflict)loc_sum((loc)lVar2,ddgrid_ddd[x]);
            psVar3 = square(c,grid_00);
            flag_off(psVar3->info,3,2);
            _Var1 = square_isfloor(c,grid_00);
            if ((!_Var1) || (_Var1 = square_isvisibletrap(c,grid_00), _Var1)) {
              square_memorize(c,grid_00);
              square_mark(c,grid_00);
            }
          }
          goto LAB_0012fb88;
        }
      }
    }
    grid.y = grid.y + 1;
  } while( true );
}

Assistant:

void wiz_dark(struct chunk *c, struct player *p, bool full)
{
	int i, y, x;

	/* Scan all grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);

			/* Process all non-walls */
			if (!square_seemslikewall(c, grid)) {
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Scan all neighbors */
				for (i = 0; i < 9; i++) {
					struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);

					/* Perma-darken the grid */
					sqinfo_off(square(c, a_grid)->info, SQUARE_GLOW);

					/* Memorize normal features */
					if (!square_isfloor(c, a_grid) || 
						square_isvisibletrap(c, a_grid)) {
						square_memorize(c, a_grid);
						square_mark(c, a_grid);
					}
				}
			}

			/* Memorize objects */
			if (full) {
				square_know_pile(c, grid, NULL);
			} else {
				square_sense_pile(c, grid, NULL);
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (!square_ismark(c, grid)
					&& square_ismemorybad(c, grid)) {
				square_forget(c, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(c, grid)) continue;
			square_unmark(c, grid);
		}
	}

	/* Fully update the visuals */
	p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	p->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}